

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::generateFullDeclaration
               (ostringstream *src,StructType *structType,int indentLevel)

{
  bool bVar1;
  int indentLevel_00;
  deUint32 dVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer pSVar5;
  VarType *type;
  Indent local_44;
  StructMember *local_40;
  Indent local_34;
  __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
  local_30;
  __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
  local_28;
  ConstIterator memberIter;
  int indentLevel_local;
  StructType *structType_local;
  ostringstream *src_local;
  
  memberIter._M_current._4_4_ = indentLevel;
  std::operator<<((ostream *)src,"struct");
  pcVar3 = StructType::getTypeName(structType);
  if (pcVar3 != (char *)0x0) {
    poVar4 = std::operator<<((ostream *)src," ");
    pcVar3 = StructType::getTypeName(structType);
    std::operator<<(poVar4,pcVar3);
  }
  poVar4 = std::operator<<((ostream *)src,"\n");
  Indent::Indent((Indent *)&memberIter,memberIter._M_current._4_4_);
  poVar4 = operator<<(poVar4,(Indent *)&memberIter);
  std::operator<<(poVar4,"{\n");
  local_28._M_current = (StructMember *)StructType::begin(structType);
  while( true ) {
    local_30._M_current = (StructMember *)StructType::end(structType);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    Indent::Indent(&local_34,memberIter._M_current._4_4_ + 1);
    operator<<((ostream *)src,&local_34);
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
             ::operator->(&local_28);
    type = StructMember::getType(pSVar5);
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
             ::operator->(&local_28);
    pcVar3 = StructMember::getName(pSVar5);
    indentLevel_00 = memberIter._M_current._4_4_ + 1;
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
             ::operator->(&local_28);
    dVar2 = StructMember::getFlags(pSVar5);
    generateDeclaration(src,type,pcVar3,indentLevel_00,dVar2 & 0xc00);
    local_40 = (StructMember *)
               __gnu_cxx::
               __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
               ::operator++(&local_28,0);
  }
  Indent::Indent(&local_44,memberIter._M_current._4_4_);
  poVar4 = operator<<((ostream *)src,&local_44);
  std::operator<<(poVar4,"}");
  return;
}

Assistant:

void generateFullDeclaration (std::ostringstream& src, const StructType& structType, int indentLevel)
{
	src << "struct";
	if (structType.getTypeName())
		src << " " << structType.getTypeName();
	src << "\n" << Indent(indentLevel) << "{\n";

	for (StructType::ConstIterator memberIter = structType.begin(); memberIter != structType.end(); memberIter++)
	{
		src << Indent(indentLevel+1);
		generateDeclaration(src, memberIter->getType(), memberIter->getName(), indentLevel+1, memberIter->getFlags() & UNUSED_BOTH);
	}

	src << Indent(indentLevel) << "}";
}